

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

float Gia_ManPatGetQuo(Gia_Man_t *p,Vec_Int_t *vRareCounts,Vec_Wrd_t *vSims,int n,int nWords)

{
  int Lit;
  int iVar1;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  int i;
  float local_48;
  
  if (vSims->nSize == p->nObjs) {
    local_48 = 0.0;
    for (i = 1; i < vRareCounts->nSize; i = i + 2) {
      Lit = Vec_IntEntry(vRareCounts,i + -1);
      iVar1 = Vec_IntEntry(vRareCounts,i);
      iVar2 = Abc_Lit2Var(Lit);
      uVar3 = Abc_LitIsCompl(Lit);
      pwVar4 = Vec_WrdEntryP(vSims,iVar2 * nWords);
      if (((pwVar4[n >> 6] >> (n & 0x3fU) & 1) != 0) == uVar3) {
        local_48 = local_48 + 1.0 / (float)(iVar1 + 1);
      }
    }
    return local_48;
  }
  __assert_fail("Vec_WrdSize(vSims) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x74c,"float Gia_ManPatGetQuo(Gia_Man_t *, Vec_Int_t *, Vec_Wrd_t *, int, int)");
}

Assistant:

float Gia_ManPatGetQuo( Gia_Man_t * p, Vec_Int_t * vRareCounts, Vec_Wrd_t * vSims, int n, int nWords )
{
    float Quality = 0;
    int RareLit, RareCount, i; 
    assert( Vec_WrdSize(vSims) == Gia_ManObjNum(p) );
    Vec_IntForEachEntryDouble( vRareCounts, RareLit, RareCount, i )
    {
        float Incrm = (float)1.0/(RareCount+1);
        int RareObj = Abc_Lit2Var(RareLit);
        int RareVal = Abc_LitIsCompl(RareLit);
        word * pSim = Vec_WrdEntryP( vSims, RareObj*nWords );
        if ( Abc_TtGetBit(pSim, n) == RareVal )
            Quality += Incrm;
    }
    return Quality;
}